

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlUnlinkNodeInternal(xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  _xmlNode **pp_Var3;
  long lVar4;
  
  p_Var1 = cur->parent;
  if (p_Var1 == (_xmlNode *)0x0) goto LAB_0014c3fe;
  if (cur->type == XML_ATTRIBUTE_NODE) {
    if ((xmlNodePtr)p_Var1->properties == cur) {
      pp_Var3 = (_xmlNode **)&p_Var1->properties;
      lVar4 = 0x30;
LAB_0014c3ef:
      *pp_Var3 = *(_xmlNode **)((long)&cur->_private + lVar4);
    }
  }
  else {
    if (p_Var1->children == cur) {
      p_Var1->children = cur->next;
    }
    if (p_Var1->last == cur) {
      pp_Var3 = &p_Var1->last;
      lVar4 = 0x38;
      goto LAB_0014c3ef;
    }
  }
  cur->parent = (_xmlNode *)0x0;
LAB_0014c3fe:
  p_Var1 = cur->next;
  p_Var2 = cur->prev;
  if (p_Var1 != (_xmlNode *)0x0) {
    p_Var1->prev = p_Var2;
  }
  if (p_Var2 != (_xmlNode *)0x0) {
    p_Var2->next = p_Var1;
  }
  cur->next = (_xmlNode *)0x0;
  cur->prev = (_xmlNode *)0x0;
  return;
}

Assistant:

static void
xmlUnlinkNodeInternal(xmlNodePtr cur) {
    if (cur->parent != NULL) {
	xmlNodePtr parent;
	parent = cur->parent;
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (parent->properties == (xmlAttrPtr) cur)
		parent->properties = ((xmlAttrPtr) cur)->next;
	} else {
	    if (parent->children == cur)
		parent->children = cur->next;
	    if (parent->last == cur)
		parent->last = cur->prev;
	}
	cur->parent = NULL;
    }

    if (cur->next != NULL)
        cur->next->prev = cur->prev;
    if (cur->prev != NULL)
        cur->prev->next = cur->next;
    cur->next = NULL;
    cur->prev = NULL;
}